

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,GLfloat *values,int count,int tupleSize)

{
  QOpenGLShaderProgramPrivate *this_00;
  undefined4 in_ECX;
  QMessageLogger *in_RDX;
  int in_ESI;
  uint in_R8D;
  long in_FS_OFFSET;
  QOpenGLShaderProgramPrivate *d;
  GLsizei in_stack_ffffffffffffffa8;
  GLint in_stack_ffffffffffffffac;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QOpenGLShaderProgram *)0x177a27);
  if (in_ESI != -1) {
    if (in_R8D == 1) {
      QOpenGLFunctions::glUniform1fv
                ((QOpenGLFunctions *)this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (GLfloat *)0x177a5c);
    }
    else if (in_R8D == 2) {
      QOpenGLFunctions::glUniform2fv
                ((QOpenGLFunctions *)this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (GLfloat *)0x177a86);
    }
    else if (in_R8D == 3) {
      QOpenGLFunctions::glUniform3fv
                ((QOpenGLFunctions *)this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (GLfloat *)0x177aad);
    }
    else if (in_R8D == 4) {
      QOpenGLFunctions::glUniform4fv
                ((QOpenGLFunctions *)this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                 (GLfloat *)0x177ad4);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_RDX,(char *)CONCAT44(in_ECX,in_R8D),(int)((ulong)this_00 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QMessageLogger::warning
                (local_28,"QOpenGLShaderProgram::setUniformValue: size %d not supported",
                 (ulong)in_R8D);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const GLfloat *values, int count, int tupleSize)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        if (tupleSize == 1)
            d->glfuncs->glUniform1fv(location, count, values);
        else if (tupleSize == 2)
            d->glfuncs->glUniform2fv(location, count, values);
        else if (tupleSize == 3)
            d->glfuncs->glUniform3fv(location, count, values);
        else if (tupleSize == 4)
            d->glfuncs->glUniform4fv(location, count, values);
        else
            qWarning("QOpenGLShaderProgram::setUniformValue: size %d not supported", tupleSize);
    }
}